

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# submit-6MixQuery.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
QueryPolygonFromMixQuery
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,int n,
          vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *polygon)

{
  undefined8 *puVar1;
  pointer ppVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int i;
  pair<double,_double> *ppVar7;
  int *__x;
  double local_a8;
  double dStack_a0;
  GridSet_conflict grid_set;
  
  if (ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
      ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start) {
    ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  }
  ppVar2 = (polygon->
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = 0;
  uVar6 = 0;
  if (0 < n) {
    uVar6 = (ulong)(uint)n;
  }
  for (; uVar6 * 0x10 != lVar5; lVar5 = lVar5 + 0x10) {
    puVar1 = (undefined8 *)((long)&ppVar2->first + lVar5);
    uVar3 = puVar1[1];
    *(undefined8 *)((long)pgon[0] + lVar5) = *puVar1;
    *(undefined8 *)((long)pgon[0] + lVar5 + 8) = uVar3;
  }
  GridSetup(pgon,n,100,&grid_set);
  __x = Point_id;
  ppVar7 = Point;
  for (lVar5 = 0; lVar5 < Point_cnt; lVar5 = lVar5 + 1) {
    local_a8 = ppVar7->first;
    dStack_a0 = ppVar7->second;
    iVar4 = GridTest(&grid_set,&local_a8);
    if ((iVar4 != 0) && (is_erase_Point[*__x % 0xf4247] == false)) {
      std::vector<int,_std::allocator<int>_>::push_back(&ans,__x);
    }
    __x = __x + 1;
    ppVar7 = ppVar7 + 1;
  }
  GridCleanup(&grid_set);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,&ans);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> QueryPolygonFromMixQuery(int n, std::vector<std::pair<double, double>> &polygon) {
    ans.clear();
    GridSet grid_set;
    for (int i = 0; i < n; i++)
        pgon[i][0] = polygon[i].first,
        pgon[i][1] = polygon[i].second;
    GridSetup(pgon, n, Grid_Resolution, &grid_set);
    for (int i = 0; i<Point_cnt; i++) {
        double point[2];
        point[0] = Point[i].first, point[1] = Point[i].second;
        if (GridTest(&grid_set, point))
            if (!is_erase_Point[Point_id[i]%mod])
                ans.push_back(Point_id[i]);
    }
    GridCleanup(&grid_set);
    return ans;
}